

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void error<String,String,String>(char *fmtstr,String *args,String *args_1,String *args_2)

{
  String local_60;
  String local_40;
  
  String::String(&local_40,fmtstr);
  format<String,String,String>(&local_60,&local_40,args,args_1,args_2);
  error(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void error (const char* fmtstr, const argtypes&... args)
{
	error (format (String (fmtstr), args...));
}